

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O1

void __thiscall VCFilter::VCFilter(VCFilter *this)

{
  QAnyStringView QVar1;
  
  (this->Guid).d.d = (Data *)0x0;
  (this->Guid).d.ptr = (char16_t *)0x0;
  (this->Filter).d.ptr = (char16_t *)0x0;
  (this->Filter).d.size = 0;
  (this->Name).d.size = 0;
  (this->Filter).d.d = (Data *)0x0;
  (this->Name).d.d = (Data *)0x0;
  (this->Name).d.ptr = (char16_t *)0x0;
  (this->Guid).d.size = 0;
  this->ParseFiles = unset;
  this->Config = (VCConfiguration *)0x0;
  (this->Files).d.d = (Data *)0x0;
  (this->Files).d.ptr = (VCFilterFile *)0x0;
  (this->Files).d.size = 0;
  (this->CustomBuildTool).super_VCToolBase._vptr_VCToolBase =
       (_func_int **)&PTR__VCCustomBuildTool_002dfa18;
  memset(&(this->CustomBuildTool).AdditionalDependencies,0,0x90);
  QVar1.m_size = (size_t)"VCCustomBuildTool";
  QVar1.field_0.m_data = &(this->CustomBuildTool).ToolName;
  QString::assign(QVar1);
  VCCLCompilerTool::VCCLCompilerTool(&this->CompilerTool);
  this->useCustomBuildTool = false;
  this->useCompilerTool = false;
  return;
}

Assistant:

VCFilter::VCFilter()
    :   ParseFiles(unset),
        Config(nullptr)
{
    useCustomBuildTool = false;
    useCompilerTool = false;
}